

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

ON_Mesh * __thiscall ON_Mesh::operator=(ON_Mesh *this,ON_Mesh *src)

{
  bool bVar1;
  ON_MeshNgon **ppOVar2;
  uint *puVar3;
  ON_MeshParameters *__dest;
  ON_MeshCurvatureStats *pOVar4;
  uint local_5c;
  int local_3c;
  ON_MeshNgon *pOStack_38;
  int i;
  ON_MeshNgon *ngon;
  ON_MeshNgon *src_ngon;
  uint i_1;
  uint src_F_count;
  uint src_V_count;
  uint ngon_count;
  ON_Mesh *src_local;
  ON_Mesh *this_local;
  
  if (this != src) {
    _src_V_count = src;
    src_local = this;
    Destroy(this);
    ON_Geometry::operator=(&this->super_ON_Geometry,&_src_V_count->super_ON_Geometry);
    ON_3fPointArray::operator=(&this->m_V,&_src_V_count->m_V);
    ON_3dPointArray::operator=(&this->m_dV,&_src_V_count->m_dV);
    ON_SimpleArray<ON_MeshFace>::operator=(&this->m_F,&_src_V_count->m_F);
    ON_3fVectorArray::operator=(&this->m_N,&_src_V_count->m_N);
    ON_3fVectorArray::operator=(&this->m_FN,&_src_V_count->m_FN);
    ON_2fPointArray::operator=(&this->m_T,&_src_V_count->m_T);
    ON_ClassArray<ON_TextureCoordinates>::operator=(&this->m_TC,&_src_V_count->m_TC);
    ON_2dPointArray::operator=(&this->m_S,&_src_V_count->m_S);
    ON_SimpleArray<bool>::operator=(&this->m_H,&_src_V_count->m_H);
    this->m_hidden_count = _src_V_count->m_hidden_count;
    bVar1 = HasNgons(_src_V_count);
    if (bVar1) {
      local_5c = ON_SimpleArray<ON_MeshNgon_*>::UnsignedCount(&_src_V_count->m_Ngon);
    }
    else {
      local_5c = 0;
    }
    src_F_count = local_5c;
    if (local_5c != 0) {
      i_1 = ON_SimpleArray<ON_3fPoint>::UnsignedCount
                      (&(_src_V_count->m_V).super_ON_SimpleArray<ON_3fPoint>);
      src_ngon._4_4_ = ON_SimpleArray<ON_MeshFace>::UnsignedCount(&_src_V_count->m_F);
      ON_SimpleArray<ON_MeshNgon_*>::Reserve(&this->m_Ngon,(ulong)src_F_count);
      for (src_ngon._0_4_ = 0; (uint)src_ngon < src_F_count; src_ngon._0_4_ = (uint)src_ngon + 1) {
        ppOVar2 = ON_SimpleArray<ON_MeshNgon_*>::operator[](&_src_V_count->m_Ngon,(uint)src_ngon);
        ngon = *ppOVar2;
        if (((ngon != (ON_MeshNgon *)0x0) && (ngon->m_Vcount != 0)) && (ngon->m_vi != (uint *)0x0))
        {
          if (i_1 < ngon->m_Vcount) {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                       ,0x220,"","Corrupt ngon");
          }
          else if (src_ngon._4_4_ < ngon->m_Fcount) {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                       ,0x225,"","Corrupt ngon");
          }
          else if ((ngon->m_fi == (uint *)0x0) && (ngon->m_Fcount != 0)) {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                       ,0x22a,"","Corrupt ngon");
          }
          else {
            pOStack_38 = ON_MeshNgonAllocator::CopyNgon(&this->m_NgonAllocator,ngon);
            if (pOStack_38 != (ON_MeshNgon *)0x0) {
              ON_SimpleArray<ON_MeshNgon_*>::Append(&this->m_Ngon,&stack0xffffffffffffffc8);
            }
          }
        }
      }
      puVar3 = NgonMap(_src_V_count);
      if (puVar3 != (uint *)0x0) {
        CreateNgonMap(this);
      }
    }
    memcpy(&this->m_Ctag,&_src_V_count->m_Ctag,0x98);
    memcpy(&this->m_Ttag,&_src_V_count->m_Ttag,0x98);
    *(undefined8 *)&this->field_0x270 = *(undefined8 *)&_src_V_count->field_0x270;
    *(undefined8 *)&this->field_0x278 = *(undefined8 *)&_src_V_count->field_0x278;
    *(undefined8 *)&this->field_0x280 = *(undefined8 *)&_src_V_count->field_0x280;
    *(undefined8 *)&this->field_0x288 = *(undefined8 *)&_src_V_count->field_0x288;
    *(undefined8 *)&this->field_0x240 = *(undefined8 *)&_src_V_count->field_0x240;
    *(undefined8 *)&this->field_0x248 = *(undefined8 *)&_src_V_count->field_0x248;
    *(undefined8 *)&this->field_0x250 = *(undefined8 *)&_src_V_count->field_0x250;
    *(undefined8 *)&this->field_0x258 = *(undefined8 *)&_src_V_count->field_0x258;
    this->m_srf_scale[0] = _src_V_count->m_srf_scale[0];
    this->m_srf_scale[1] = _src_V_count->m_srf_scale[1];
    this->m_packed_tex_rotate = (bool)(_src_V_count->m_packed_tex_rotate & 1);
    ON_SimpleArray<ON_SurfaceCurvature>::operator=(&this->m_K,&_src_V_count->m_K);
    ON_SimpleArray<ON_Color>::operator=(&this->m_C,&_src_V_count->m_C);
    this->m_parent = _src_V_count->m_parent;
    if (this->m_mesh_parameters != (ON_MeshParameters *)0x0) {
      if (this->m_mesh_parameters != (ON_MeshParameters *)0x0) {
        operator_delete(this->m_mesh_parameters,0xe0);
      }
      this->m_mesh_parameters = (ON_MeshParameters *)0x0;
    }
    if (_src_V_count->m_mesh_parameters != (ON_MeshParameters *)0x0) {
      __dest = (ON_MeshParameters *)operator_new(0xe0);
      memcpy(__dest,_src_V_count->m_mesh_parameters,0xe0);
      this->m_mesh_parameters = __dest;
    }
    this->m_invalid_count = _src_V_count->m_invalid_count;
    this->m_quad_count = _src_V_count->m_quad_count;
    this->m_triangle_count = _src_V_count->m_triangle_count;
    this->m_mesh_is_closed = _src_V_count->m_mesh_is_closed;
    this->m_mesh_is_manifold = _src_V_count->m_mesh_is_manifold;
    this->m_mesh_is_oriented = _src_V_count->m_mesh_is_oriented;
    this->m_mesh_is_solid = _src_V_count->m_mesh_is_solid;
    memcpy(&this->m_vertex_bbox,&_src_V_count->m_vertex_bbox,0x30);
    memcpy(&this->m_tight_bbox_cache,&_src_V_count->m_tight_bbox_cache,0x248);
    *(undefined8 *)this->m_nbox[0] = *(undefined8 *)_src_V_count->m_nbox[0];
    *(undefined8 *)(this->m_nbox[0] + 2) = *(undefined8 *)(_src_V_count->m_nbox[0] + 2);
    *(undefined8 *)(this->m_nbox[1] + 1) = *(undefined8 *)(_src_V_count->m_nbox[1] + 1);
    this->m_tbox[0] = _src_V_count->m_tbox[0];
    this->m_tbox[1] = _src_V_count->m_tbox[1];
    for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
      if (this->m_kstat[local_3c] != (ON_MeshCurvatureStats *)0x0) {
        pOVar4 = this->m_kstat[local_3c];
        if (pOVar4 != (ON_MeshCurvatureStats *)0x0) {
          ON_MeshCurvatureStats::~ON_MeshCurvatureStats(pOVar4);
          operator_delete(pOVar4,0x40);
        }
        this->m_kstat[local_3c] = (ON_MeshCurvatureStats *)0x0;
      }
      if (_src_V_count->m_kstat[local_3c] != (ON_MeshCurvatureStats *)0x0) {
        pOVar4 = (ON_MeshCurvatureStats *)operator_new(0x40);
        ON_MeshCurvatureStats::ON_MeshCurvatureStats(pOVar4,_src_V_count->m_kstat[local_3c]);
        this->m_kstat[local_3c] = pOVar4;
      }
    }
  }
  return this;
}

Assistant:

ON_Mesh& ON_Mesh::operator=( const ON_Mesh& src )
{
  if ( this != &src ) 
  {
    Destroy();
    ON_Geometry::operator=(src);

    m_V  = src.m_V;
    m_dV = src.m_dV;
    m_F  = src.m_F;
    m_N  = src.m_N;
    m_FN = src.m_FN;
    m_T  = src.m_T;
    m_TC = src.m_TC;
    m_S  = src.m_S;
    m_H  = src.m_H;
    m_hidden_count = src.m_hidden_count;


    unsigned int ngon_count = src.HasNgons() ? src.m_Ngon.UnsignedCount() : 0;
    if ( ngon_count > 0 )
    {
      const unsigned int src_V_count = src.m_V.UnsignedCount();
      const unsigned int src_F_count = src.m_F.UnsignedCount();
      m_Ngon.Reserve(ngon_count);
      for ( unsigned int i = 0; i < ngon_count; i++ )
      {
        const ON_MeshNgon* src_ngon = src.m_Ngon[i];
        if ( 0 == src_ngon )
          continue;
        if ( src_ngon->m_Vcount <= 0 )
          continue;
        if ( 0 == src_ngon->m_vi )
          continue;
        if ( src_ngon->m_Vcount > src_V_count )
        {
          ON_ERROR("Corrupt ngon");
          continue;
        }
        if ( src_ngon->m_Fcount > src_F_count )
        {
          ON_ERROR("Corrupt ngon");
          continue;
        }
        if ( 0 == src_ngon->m_fi && src_ngon->m_Fcount > 0 )
        {
          ON_ERROR("Corrupt ngon");
          continue;
        }
        ON_MeshNgon* ngon = m_NgonAllocator.CopyNgon(src_ngon);
        if (ngon)
          m_Ngon.Append(ngon);
      }
      if ( 0 != src.NgonMap())
      {
        this->CreateNgonMap();
      }
    }

    m_Ctag = src.m_Ctag;
    m_Ttag = src.m_Ttag;
    m_packed_tex_domain[0] = src.m_packed_tex_domain[0];
    m_packed_tex_domain[1] = src.m_packed_tex_domain[1];
    m_srf_domain[0] = src.m_srf_domain[0];
    m_srf_domain[1] = src.m_srf_domain[1];
    m_srf_scale[0] = src.m_srf_scale[0];
    m_srf_scale[1] = src.m_srf_scale[1];
    m_packed_tex_rotate = src.m_packed_tex_rotate;

    m_K = src.m_K;
    m_C = src.m_C;

    m_parent         = src.m_parent;
    //m_material_index = src.m_material_index;

    if ( m_mesh_parameters ) {
      delete m_mesh_parameters;
      m_mesh_parameters = 0;
    }
    if ( src.m_mesh_parameters )
      m_mesh_parameters = new ON_MeshParameters(*src.m_mesh_parameters);

    m_invalid_count = src.m_invalid_count;
    m_quad_count = src.m_quad_count;
    m_triangle_count = src.m_triangle_count;

    m_mesh_is_closed = src.m_mesh_is_closed;
    m_mesh_is_manifold = src.m_mesh_is_manifold;
    m_mesh_is_oriented = src.m_mesh_is_oriented;
    m_mesh_is_solid    = src.m_mesh_is_solid;

    m_vertex_bbox = src.m_vertex_bbox;
    m_tight_bbox_cache = src.m_tight_bbox_cache;
    memcpy(m_nbox,src.m_nbox,sizeof(m_nbox));
    memcpy(m_tbox,src.m_tbox,sizeof(m_tbox));

    int i;
    for ( i = 0; i < 4; i++ ) {
      if ( m_kstat[i] ) 
      {
        delete m_kstat[i];
        m_kstat[i] = 0;
      }
      if ( src.m_kstat[i] )
      {
        m_kstat[i] = new ON_MeshCurvatureStats(*src.m_kstat[i]);
      }
    }

    // do not copy m_top

    // Do not copy m_mesh_cache. Cached information will
    // be recalculated if it is needed.
  }
  return *this;
}